

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_HasProperty
               (Var instance,PropertyId propertyId,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  DynamicObject *instance_00;
  
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    instance_00 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).numberPrototype.ptr;
  }
  else {
    instance_00 = (DynamicObject *)VarTo<Js::RecyclableObject>(instance);
  }
  BVar2 = HasProperty(&instance_00->super_RecyclableObject,propertyId);
  return BVar2;
}

Assistant:

BOOL JavascriptOperators::OP_HasProperty(Var instance, PropertyId propertyId, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_HasProperty);
        RecyclableObject* object = TaggedNumber::Is(instance) ?
            scriptContext->GetLibrary()->GetNumberPrototype() :
            VarTo<RecyclableObject>(instance);
        BOOL result = HasProperty(object, propertyId);
        return result;
        JIT_HELPER_END(Op_HasProperty);
    }